

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall estl::shared_ptr<MyClass>::decrease_counters(shared_ptr<MyClass> *this)

{
  use_counter_type *puVar1;
  control_block *pcVar2;
  
  if ((this->ptr_ != (MyClass *)0x0) && (this->control_block_ptr_ != (control_block *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"decref() ",9);
    control_block::dbg(this->control_block_ptr_);
    pcVar2 = this->control_block_ptr_;
    LOCK();
    (pcVar2->use_count_).super___atomic_base<unsigned_int>._M_i =
         (pcVar2->use_count_).super___atomic_base<unsigned_int>._M_i - 1;
    UNLOCK();
    if ((pcVar2->use_count_).super___atomic_base<unsigned_int>._M_i == 0) {
      destroy(this);
    }
    LOCK();
    puVar1 = &this->control_block_ptr_->control_block_count_;
    (puVar1->super___atomic_base<unsigned_int>)._M_i =
         (puVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((puVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
      destroy_control_block(this);
      return;
    }
  }
  return;
}

Assistant:

void decrease_counters()
    {
        if (!ptr_ || !control_block_ptr_) {
            return;
        }

        std::cerr << "decref() "; control_block_ptr_->dbg();
        if (--(control_block_ptr_->use_count_) == 0) {
            destroy();
        }
        if (--(control_block_ptr_->control_block_count_) == 0) {
            destroy_control_block();
        }
    }